

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_object_preventExtensions
                  (JSContext *ctx,JSValue this_val,int argc,JSValue *argv,int reflect)

{
  JSValue v;
  int iVar1;
  JSContext *in_RDI;
  JSValueUnion *in_R8;
  int in_R9D;
  int ret;
  JSValue obj;
  undefined4 in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff8c;
  JSValueUnion JVar2;
  JSValueUnion JVar3;
  JSValueUnion local_30;
  int64_t local_28;
  undefined4 uStack_c;
  
  JVar2 = (JSValueUnion)in_R8->ptr;
  JVar3 = in_R8[1];
  if (JVar3.int32 == -1) {
    iVar1 = JS_PreventExtensions
                      ((JSContext *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88),
                       *(JSValue *)in_R8);
    if (iVar1 < 0) {
      local_30.ptr = (void *)(local_30 << 0x20);
      local_28 = 6;
    }
    else if (in_R9D == 0) {
      if (iVar1 == 0) {
        _local_30 = JS_ThrowTypeError(in_RDI,"proxy preventExtensions handler returned false");
      }
      else {
        v.tag = (int64_t)JVar3.ptr;
        v.u.float64 = JVar2.float64;
        _local_30 = JS_DupValue(in_RDI,v);
      }
    }
    else {
      local_30.int32._1_3_ = 0;
      local_30.int32._0_1_ = iVar1 != 0;
      local_30._4_4_ = uStack_c;
      local_28 = 1;
    }
  }
  else if (in_R9D == 0) {
    _local_30 = JS_DupValue(in_RDI,*(JSValue *)in_R8);
  }
  else {
    _local_30 = JS_ThrowTypeErrorNotAnObject((JSContext *)0x1a88c2);
  }
  return _local_30;
}

Assistant:

static JSValue js_object_preventExtensions(JSContext *ctx, JSValueConst this_val,
                                           int argc, JSValueConst *argv, int reflect)
{
    JSValueConst obj;
    int ret;

    obj = argv[0];
    if (JS_VALUE_GET_TAG(obj) != JS_TAG_OBJECT) {
        if (reflect)
            return JS_ThrowTypeErrorNotAnObject(ctx);
        else
            return JS_DupValue(ctx, obj);
    }
    ret = JS_PreventExtensions(ctx, obj);
    if (ret < 0)
        return JS_EXCEPTION;
    if (reflect) {
        return JS_NewBool(ctx, ret);
    } else {
        if (!ret)
            return JS_ThrowTypeError(ctx, "proxy preventExtensions handler returned false");
        return JS_DupValue(ctx, obj);
    }
}